

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_curve.cpp
# Opt level: O0

bool __thiscall
ON_Curve::IsContinuous
          (ON_Curve *this,continuity desired_continuity,double t,int *hint,double point_tolerance,
          double d1_tolerance,double d2_tolerance,double cos_angle_tolerance,
          double curvature_tolerance)

{
  ON_3dVector Km_00;
  ON_3dVector Km_01;
  ON_3dVector Kp_00;
  ON_3dVector Kp_01;
  bool bVar1;
  bool bVar2;
  uint uVar3;
  continuity cVar4;
  double *pdVar5;
  double dVar6;
  byte local_2cc;
  byte local_2cb;
  byte local_2c9;
  ON_3dVector local_230;
  ON_3dVector local_218;
  ON_3dVector local_200;
  ON_3dVector local_1e8;
  ON_3dVector local_1d0;
  ON_3dVector local_1b8;
  ON_3dVector local_1a0;
  ON_3dVector local_188;
  double local_170;
  double t1;
  double t0;
  undefined1 auStack_158 [7];
  bool bIsClosed;
  ON_3dVector Kp;
  ON_3dVector Km;
  ON_3dVector Tp;
  ON_3dVector Tm;
  ON_3dVector D2p;
  ON_3dVector D2m;
  ON_3dVector D1p;
  ON_3dVector D1m;
  ON_3dPoint Pp;
  ON_3dPoint Pm;
  ON_Interval domain;
  double curvature_tolerance_local;
  double cos_angle_tolerance_local;
  double d2_tolerance_local;
  double d1_tolerance_local;
  double point_tolerance_local;
  int *hint_local;
  double t_local;
  continuity desired_continuity_local;
  ON_Curve *this_local;
  
  (*(this->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x25])();
  bVar1 = ON_Interval::IsIncreasing((ON_Interval *)&Pm.z);
  if (!bVar1) {
    return true;
  }
  t0._7_1_ = 0;
  local_170 = t;
  t1 = t;
  if ((desired_continuity < C0_locus_continuous) || (4 < desired_continuity - C0_locus_continuous))
  {
    pdVar5 = ON_Interval::operator[]((ON_Interval *)&Pm.z,0);
    if ((t <= *pdVar5) || (pdVar5 = ON_Interval::operator[]((ON_Interval *)&Pm.z,1), *pdVar5 <= t))
    {
      return true;
    }
  }
  else {
    pdVar5 = ON_Interval::operator[]((ON_Interval *)&Pm.z,0);
    if (t <= *pdVar5) {
      return true;
    }
    pdVar5 = ON_Interval::operator[]((ON_Interval *)&Pm.z,1);
    if ((t == *pdVar5) && (!NAN(t) && !NAN(*pdVar5))) {
      uVar3 = (*(this->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x34])();
      if ((uVar3 & 1) == 0) {
        return false;
      }
      if (desired_continuity == C0_locus_continuous) {
        return true;
      }
      t0._7_1_ = 1;
      pdVar5 = ON_Interval::operator[]((ON_Interval *)&Pm.z,0);
      t1 = *pdVar5;
      pdVar5 = ON_Interval::operator[]((ON_Interval *)&Pm.z,1);
      local_170 = *pdVar5;
    }
  }
  cVar4 = ON::ParametricContinuity(desired_continuity);
  switch(cVar4) {
  case unknown_continuity:
    break;
  case C0_continuous:
    bVar1 = EvPoint(this,local_170,(ON_3dPoint *)&Pp.z,-1,hint);
    if (!bVar1) {
      return false;
    }
    bVar1 = EvPoint(this,t1,(ON_3dPoint *)&D1m.z,1,hint);
    if (!bVar1) {
      return false;
    }
    if ((t0._7_1_ & 1) != 0) {
      Pp.z = D1m.z;
      Pm.x = Pp.x;
      Pm.y = Pp.y;
    }
    ON_3dPoint::operator-(&local_188,(ON_3dPoint *)&Pp.z,(ON_3dPoint *)&D1m.z);
    bVar1 = ON_3dVector::IsTiny(&local_188,point_tolerance);
    if (((bVar1 ^ 0xffU) & 1) != 0) {
      return false;
    }
    break;
  case C1_continuous:
    bVar1 = Ev1Der(this,local_170,(ON_3dPoint *)&Pp.z,(ON_3dVector *)&D1p.z,-1,hint);
    if (!bVar1) {
      return false;
    }
    bVar1 = Ev1Der(this,t1,(ON_3dPoint *)&D1m.z,(ON_3dVector *)&D2m.z,1,hint);
    if (!bVar1) {
      return false;
    }
    if ((t0._7_1_ & 1) != 0) {
      Pp.z = D1m.z;
      Pm.x = Pp.x;
      Pm.y = Pp.y;
    }
    ON_3dPoint::operator-(&local_1a0,(ON_3dPoint *)&Pp.z,(ON_3dPoint *)&D1m.z);
    bVar1 = ON_3dVector::IsTiny(&local_1a0,point_tolerance);
    local_2c9 = 1;
    if (bVar1) {
      ON_3dVector::operator-(&local_1b8,(ON_3dVector *)&D1p.z,(ON_3dVector *)&D2m.z);
      bVar1 = ON_3dVector::IsTiny(&local_1b8,d1_tolerance);
      local_2c9 = bVar1 ^ 0xff;
    }
    if ((local_2c9 & 1) != 0) {
      return false;
    }
    break;
  case C2_continuous:
    bVar1 = Ev2Der(this,local_170,(ON_3dPoint *)&Pp.z,(ON_3dVector *)&D1p.z,(ON_3dVector *)&D2p.z,-1
                   ,hint);
    if (!bVar1) {
      return false;
    }
    bVar1 = Ev2Der(this,t1,(ON_3dPoint *)&D1m.z,(ON_3dVector *)&D2m.z,(ON_3dVector *)&Tm.z,1,hint);
    if (!bVar1) {
      return false;
    }
    if ((t0._7_1_ & 1) != 0) {
      Pp.z = D1m.z;
      Pm.x = Pp.x;
      Pm.y = Pp.y;
    }
    ON_3dPoint::operator-(&local_1e8,(ON_3dPoint *)&Pp.z,(ON_3dPoint *)&D1m.z);
    bVar1 = ON_3dVector::IsTiny(&local_1e8,point_tolerance);
    local_2cb = 1;
    if (bVar1) {
      ON_3dVector::operator-(&local_200,(ON_3dVector *)&D1p.z,(ON_3dVector *)&D2m.z);
      bVar1 = ON_3dVector::IsTiny(&local_200,d1_tolerance);
      local_2cb = 1;
      if (bVar1) {
        ON_3dVector::operator-(&local_218,(ON_3dVector *)&D2p.z,(ON_3dVector *)&Tm.z);
        bVar1 = ON_3dVector::IsTiny(&local_218,d2_tolerance);
        local_2cb = bVar1 ^ 0xff;
      }
    }
    if ((local_2cb & 1) != 0) {
      return false;
    }
    break;
  case G1_continuous:
    bVar1 = EvTangent(this,local_170,(ON_3dPoint *)&Pp.z,(ON_3dVector *)&Tp.z,-1,hint);
    if (!bVar1) {
      return false;
    }
    bVar1 = EvTangent(this,t1,(ON_3dPoint *)&D1m.z,(ON_3dVector *)&Km.z,1,hint);
    if (!bVar1) {
      return false;
    }
    if ((t0._7_1_ & 1) != 0) {
      Pp.z = D1m.z;
      Pm.x = Pp.x;
      Pm.y = Pp.y;
    }
    ON_3dPoint::operator-(&local_1d0,(ON_3dPoint *)&Pp.z,(ON_3dPoint *)&D1m.z);
    bVar2 = ON_3dVector::IsTiny(&local_1d0,point_tolerance);
    bVar1 = true;
    if (bVar2) {
      dVar6 = ON_3dVector::operator*((ON_3dVector *)&Tp.z,(ON_3dVector *)&Km.z);
      bVar1 = dVar6 < cos_angle_tolerance;
    }
    if (bVar1) {
      return false;
    }
    break;
  case G2_continuous:
  case Gsmooth_continuous:
    bVar1 = EvCurvature(this,local_170,(ON_3dPoint *)&Pp.z,(ON_3dVector *)&Tp.z,(ON_3dVector *)&Kp.z
                        ,-1,hint);
    if (!bVar1) {
      return false;
    }
    bVar1 = EvCurvature(this,t1,(ON_3dPoint *)&D1m.z,(ON_3dVector *)&Km.z,(ON_3dVector *)auStack_158
                        ,1,hint);
    if (!bVar1) {
      return false;
    }
    local_2cc = 0;
    if ((t0._7_1_ & 1) == 0) {
      ON_3dPoint::operator-(&local_230,(ON_3dPoint *)&Pp.z,(ON_3dPoint *)&D1m.z);
      bVar1 = ON_3dVector::IsTiny(&local_230,point_tolerance);
      local_2cc = bVar1 ^ 0xff;
    }
    if ((local_2cc & 1) != 0) {
      return false;
    }
    dVar6 = ON_3dVector::operator*((ON_3dVector *)&Tp.z,(ON_3dVector *)&Km.z);
    if (dVar6 < cos_angle_tolerance) {
      return false;
    }
    if (cVar4 == Gsmooth_continuous) {
      Km_00.y = Km.x;
      Km_00.x = Kp.z;
      Km_00.z = Km.y;
      Kp_00.y = Kp.x;
      Kp_00.x = _auStack_158;
      Kp_00.z = Kp.y;
      bVar1 = ON_IsGsmoothCurvatureContinuous(Km_00,Kp_00,cos_angle_tolerance,curvature_tolerance);
      if (!bVar1) {
        return false;
      }
    }
    else {
      Km_01.y = Km.x;
      Km_01.x = Kp.z;
      Km_01.z = Km.y;
      Kp_01.y = Kp.x;
      Kp_01.x = _auStack_158;
      Kp_01.z = Kp.y;
      bVar1 = ON_IsG2CurvatureContinuous(Km_01,Kp_01,cos_angle_tolerance,curvature_tolerance);
      if (!bVar1) {
        return false;
      }
    }
    break;
  case C0_locus_continuous:
  case C1_locus_continuous:
  case C2_locus_continuous:
  case G1_locus_continuous:
  case G2_locus_continuous:
  case Cinfinity_continuous:
  }
  return true;
}

Assistant:

bool ON_Curve::IsContinuous(
    ON::continuity desired_continuity,
    double t, 
    int* hint, // default = nullptr,
    double point_tolerance, // default=ON_ZERO_TOLERANCE
    double d1_tolerance, // default==ON_ZERO_TOLERANCE
    double d2_tolerance, // default==ON_ZERO_TOLERANCE
    double cos_angle_tolerance, // default==ON_DEFAULT_ANGLE_TOLERANCE_COSINE
    double curvature_tolerance  // default==ON_SQRT_EPSILON
    ) const
{
  ON_Interval domain = Domain();
  if ( !domain.IsIncreasing() )
  {
    return true;
  }

  ON_3dPoint Pm, Pp;
  ON_3dVector D1m, D1p, D2m, D2p, Tm, Tp, Km, Kp;

  bool bIsClosed = false;

  // 20 March 2003 Dale Lear
  //     I added this preable to handle the new
  //     locus continuity values.
  double t0 = t;
  double t1 = t;
  switch(desired_continuity)
  {
  case ON::continuity::C0_locus_continuous:
  case ON::continuity::C1_locus_continuous:
  case ON::continuity::C2_locus_continuous:
  case ON::continuity::G1_locus_continuous:
  case ON::continuity::G2_locus_continuous:
    if ( t <= domain[0] )
    {
      // By convention - see comments by ON::continuity enum.
      return true;
    }
    if ( t == domain[1] )
    {
      if ( !IsClosed() )
      {
        // open curves are not locus continuous at the end parameter
        // see comments by ON::continuity enum
        return false;
      }
      else 
      {
        if ( ON::continuity::C0_locus_continuous == desired_continuity )
        {
          return true;
        }
        bIsClosed = true;
      }

      t0 = domain[0];
      t1 = domain[1];
    }
    break;

  case ON::continuity::unknown_continuity:
  case ON::continuity::C0_continuous:
  case ON::continuity::C1_continuous:
  case ON::continuity::C2_continuous:
  case ON::continuity::G1_continuous:
  case ON::continuity::G2_continuous:
  case ON::continuity::Cinfinity_continuous:
  case ON::continuity::Gsmooth_continuous:
  default:
    // does not change pre 20 March behavior - just skips the out
    // of domain evaluation on parametric queries.
    if ( t <= domain[0] || t >= domain[1] )
      return true;
    break;
  }

  // at this point, no difference between parametric and locus tests.
  desired_continuity = ON::ParametricContinuity((int)desired_continuity);


  // this is slow and uses evaluation
  // virtual overrides on curve classes that can have multiple spans
  // are much faster because the avoid evaluation
  switch ( desired_continuity )
  {
  case ON::continuity::unknown_continuity:
    break;

  case ON::continuity::C0_continuous:  
    if ( !EvPoint( t1, Pm, -1, hint ) )
      return false;
    if ( !EvPoint( t0, Pp,  1, hint ) )
      return false;
    if ( bIsClosed )
      Pm = Pp;
    if ( !(Pm-Pp).IsTiny(point_tolerance) )
      return false;
    break;

  case ON::continuity::C1_continuous:
    if ( !Ev1Der( t1, Pm, D1m, -1, hint ) )
      return false;
    if ( !Ev1Der( t0, Pp, D1p,  1, hint ) )
      return false;
    if ( bIsClosed )
      Pm = Pp;
    if ( !(Pm-Pp).IsTiny(point_tolerance) || !(D1m-D1p).IsTiny(d1_tolerance) )
      return false;
    break;

  case ON::continuity::G1_continuous:
    if ( !EvTangent( t1, Pm, Tm, -1, hint ) )
      return false;
    if ( !EvTangent( t0, Pp, Tp,  1, hint ) )
      return false;
    if ( bIsClosed )
      Pm = Pp;
    if ( !(Pm-Pp).IsTiny(point_tolerance) || Tm*Tp < cos_angle_tolerance )
      return false;
    break;

  case ON::continuity::C2_continuous:
    if ( !Ev2Der( t1, Pm, D1m, D2m, -1, hint ) )
      return false;
    if ( !Ev2Der( t0, Pp, D1p, D2p,  1, hint ) )
      return false;
    if ( bIsClosed )
      Pm = Pp;
    if ( !(Pm-Pp).IsTiny(point_tolerance) || !(D1m-D1p).IsTiny(d1_tolerance) || !(D2m-D2p).IsTiny(d2_tolerance) )
      return false;
    break;

  case ON::continuity::G2_continuous:
  case ON::continuity::Gsmooth_continuous:
    if ( !EvCurvature( t1, Pm, Tm, Km, -1, hint ) )
      return false;
    if ( !EvCurvature( t0, Pp, Tp, Kp,  1, hint ) )
      return false;
    if ( !bIsClosed && !(Pm-Pp).IsTiny(point_tolerance) )
      return false;
    if ( Tm*Tp < cos_angle_tolerance )
      return false; // tangent discontinuity

    if ( desired_continuity == ON::continuity::Gsmooth_continuous )
    {
      if ( !ON_IsGsmoothCurvatureContinuous(Km,Kp,cos_angle_tolerance,curvature_tolerance) )
        return false;
    }
    else
    {
      if ( !ON_IsG2CurvatureContinuous(Km,Kp,cos_angle_tolerance,curvature_tolerance) )
        return false;
    }
    break;

  case ON::continuity::C0_locus_continuous:
  case ON::continuity::C1_locus_continuous:
  case ON::continuity::C2_locus_continuous:
  case ON::continuity::G1_locus_continuous:
  case ON::continuity::G2_locus_continuous:
  case ON::continuity::Cinfinity_continuous:
    break;
  }

  return true;
}